

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextOutputStream.cpp
# Opt level: O3

void __thiscall
binlog::TextOutputStream::TextOutputStream
          (TextOutputStream *this,ostream *out,string *eventFormat,string *dateFormat)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  initializer_list<unsigned_long> __l;
  initializer_list<std::vector<binlog::EventSource,_std::allocator<binlog::EventSource>_>_> __l_00;
  allocator_type local_89;
  string local_88;
  string local_68;
  vector<binlog::EventSource,_std::allocator<binlog::EventSource>_> local_48;
  
  this->_out = out;
  local_48.super__Vector_base<binlog::EventSource,_std::allocator<binlog::EventSource>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  __l._M_len = 1;
  __l._M_array = (iterator)&local_48;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&this->_eventStream,__l,
             &local_89);
  local_48.super__Vector_base<binlog::EventSource,_std::allocator<binlog::EventSource>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.super__Vector_base<binlog::EventSource,_std::allocator<binlog::EventSource>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<binlog::EventSource,_std::allocator<binlog::EventSource>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  __l_00._M_len = 1;
  __l_00._M_array = &local_48;
  std::
  vector<std::vector<binlog::EventSource,_std::allocator<binlog::EventSource>_>,_std::allocator<std::vector<binlog::EventSource,_std::allocator<binlog::EventSource>_>_>_>
  ::vector(&(this->_eventStream)._eventSources._segments,__l_00,(allocator_type *)&local_89);
  std::vector<binlog::EventSource,_std::allocator<binlog::EventSource>_>::~vector(&local_48);
  (this->_eventStream)._writerProp.id = 0;
  (this->_eventStream)._writerProp.name._M_dataplus._M_p =
       (pointer)&(this->_eventStream)._writerProp.name.field_2;
  (this->_eventStream)._writerProp.name._M_string_length = 0;
  (this->_eventStream)._writerProp.name.field_2._M_local_buf[0] = '\0';
  (this->_eventStream)._writerProp.batchSize = 0;
  (this->_eventStream)._clockSync.clockValue = 0;
  (this->_eventStream)._clockSync.clockFrequency = 0;
  (this->_eventStream)._clockSync.nsSinceEpoch = 0;
  (this->_eventStream)._clockSync.tzOffset = 0;
  (this->_eventStream)._clockSync.tzName._M_dataplus._M_p =
       (pointer)&(this->_eventStream)._clockSync.tzName.field_2;
  (this->_eventStream)._clockSync.tzName._M_string_length = 0;
  (this->_eventStream)._clockSync.tzName.field_2._M_local_buf[0] = '\0';
  (this->_eventStream)._event.source = (EventSource *)0x0;
  (this->_eventStream)._event.clockValue = 0;
  (this->_eventStream)._event.arguments._begin = (char *)0x0;
  (this->_eventStream)._event.arguments._end = (char *)0x0;
  local_68._M_dataplus._M_p = (eventFormat->_M_dataplus)._M_p;
  paVar1 = &eventFormat->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p == paVar1) {
    local_68.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_68.field_2._8_8_ = *(undefined8 *)((long)&eventFormat->field_2 + 8);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  }
  else {
    local_68.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_68._M_string_length = eventFormat->_M_string_length;
  (eventFormat->_M_dataplus)._M_p = (pointer)paVar1;
  eventFormat->_M_string_length = 0;
  (eventFormat->field_2)._M_local_buf[0] = '\0';
  local_88._M_dataplus._M_p = (dateFormat->_M_dataplus)._M_p;
  paVar1 = &dateFormat->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p == paVar1) {
    local_88.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_88.field_2._8_8_ = *(undefined8 *)((long)&dateFormat->field_2 + 8);
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  }
  else {
    local_88.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_88._M_string_length = dateFormat->_M_string_length;
  (dateFormat->_M_dataplus)._M_p = (pointer)paVar1;
  dateFormat->_M_string_length = 0;
  (dateFormat->field_2)._M_local_buf[0] = '\0';
  PrettyPrinter::PrettyPrinter(&this->_printer,&local_68,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TextOutputStream::TextOutputStream(std::ostream& out, std::string eventFormat, std::string dateFormat)
  :_out(out),
   _printer(std::move(eventFormat), std::move(dateFormat))
{}